

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O0

void __thiscall rw::BBox::addPoint(BBox *this,V3d *point)

{
  float32 *pfVar1;
  V3d *point_local;
  BBox *this_local;
  
  if ((float)point->x < (float)(this->inf).x) {
    (this->inf).x = point->x;
  }
  if ((float)point->y < (float)(this->inf).y) {
    (this->inf).y = point->y;
  }
  if ((float)point->z < (float)(this->inf).z) {
    (this->inf).z = point->z;
  }
  if ((float)(this->sup).x <= (float)point->x && (float)point->x != (float)(this->sup).x) {
    (this->sup).x = point->x;
  }
  pfVar1 = &(this->sup).y;
  if ((float)*pfVar1 <= (float)point->y && (float)point->y != (float)*pfVar1) {
    (this->sup).y = point->y;
  }
  pfVar1 = &(this->sup).z;
  if ((float)*pfVar1 <= (float)point->z && (float)point->z != (float)*pfVar1) {
    (this->sup).z = point->z;
  }
  return;
}

Assistant:

void
BBox::addPoint(V3d *point)
{
	if(point->x < this->inf.x)
		this->inf.x = point->x;
	if(point->y < this->inf.y)
		this->inf.y = point->y;
	if(point->z < this->inf.z)
		this->inf.z = point->z;
	if(point->x > this->sup.x)
		this->sup.x = point->x;
	if(point->y > this->sup.y)
		this->sup.y = point->y;
	if(point->z > this->sup.z)
		this->sup.z = point->z;
}